

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_rowcol_diag_sse41_128_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  int *piVar25;
  int *piVar26;
  int *piVar27;
  int *piVar28;
  int *piVar29;
  int *piVar30;
  int *piVar31;
  int *piVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  char cVar63;
  char cVar64;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  byte bVar65;
  byte bVar66;
  char cVar67;
  byte bVar74;
  char cVar75;
  byte bVar77;
  char cVar78;
  byte bVar80;
  char cVar81;
  byte bVar83;
  char cVar84;
  byte bVar86;
  char cVar87;
  byte bVar89;
  char cVar90;
  byte bVar91;
  byte bVar92;
  char cVar93;
  ulong uVar68;
  ulong uVar69;
  byte bVar73;
  byte bVar76;
  byte bVar79;
  byte bVar82;
  byte bVar85;
  byte bVar88;
  byte bVar94;
  byte bVar95;
  char cVar96;
  byte bVar100;
  byte bVar103;
  byte bVar106;
  byte bVar109;
  byte bVar112;
  byte bVar115;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  byte bVar101;
  char cVar102;
  byte bVar104;
  char cVar105;
  byte bVar107;
  char cVar108;
  byte bVar110;
  char cVar111;
  byte bVar113;
  char cVar114;
  byte bVar116;
  char cVar117;
  byte bVar118;
  byte bVar119;
  char cVar120;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  undefined1 auVar121 [16];
  __m128i vWH_00;
  int32_t in_stack_fffffffffffff148;
  byte local_e8c;
  int local_e70;
  int local_e6c;
  int local_e58;
  int local_e54;
  int local_e40;
  int local_e3c;
  int local_e28;
  int local_e24;
  int local_e10;
  int local_e0c;
  int local_df8;
  int local_df4;
  int local_de0;
  int local_ddc;
  int local_dc8;
  int local_dc4;
  int local_db0;
  int local_dac;
  int local_d98;
  int local_d94;
  int local_d80;
  int local_d7c;
  int local_d68;
  int local_d64;
  int local_d50;
  int local_d4c;
  int local_d38;
  int local_d34;
  int local_d20;
  int local_d1c;
  int local_d08;
  int local_d04;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  int local_c80;
  int local_c7c;
  longlong *plStack_c78;
  int32_t k;
  int8_t *j_1;
  int8_t *i_1;
  int8_t *u;
  int8_t *t;
  int8_t *s;
  int8_t last_val;
  int8_t max_col;
  int8_t max_row;
  __m128i cond_all_col;
  __m128i cond_all_row;
  __m128i cond_last_val;
  __m128i cond_max_col;
  __m128i cond_max_row;
  __m128i cond_i;
  __m128i cond_j;
  __m128i vJltLimit;
  __m128i vJgtNegOne;
  __m128i vJeqLimit1;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIeqLimit1;
  __m128i vIltLimit;
  int *matrow15;
  int *matrow14;
  int *matrow13;
  int *matrow12;
  int *matrow11;
  int *matrow10;
  int *matrow9;
  int *matrow8;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vLastVal;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_910;
  int8_t score;
  int8_t POS_LIMIT;
  int iStack_90c;
  int8_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int8_t *F_pr;
  int8_t *H_pr;
  int8_t *s2;
  int8_t *_F_pr;
  int8_t *_H_pr;
  int8_t *s2B;
  int8_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  undefined1 local_858 [8];
  undefined1 local_850 [24];
  undefined1 local_838 [8];
  undefined1 local_830 [24];
  undefined1 local_818 [8];
  undefined1 local_810 [24];
  undefined1 local_7f8 [8];
  undefined1 local_7f0 [24];
  undefined1 local_7d8 [8];
  undefined1 local_7d0 [120];
  undefined1 local_758 [8];
  undefined1 local_750 [56];
  undefined1 local_718 [8];
  undefined1 local_710 [24];
  undefined1 local_6f8 [8];
  undefined1 local_6f0 [56];
  undefined1 local_6b8 [8];
  undefined1 local_6b0 [24];
  undefined1 local_698 [8];
  undefined1 local_690 [392];
  char local_508;
  char cStack_507;
  char cStack_506;
  char cStack_505;
  char cStack_504;
  char cStack_503;
  char cStack_502;
  char cStack_501;
  char cStack_500;
  char cStack_4ff;
  char cStack_4fe;
  char cStack_4fd;
  char cStack_4fc;
  char cStack_4fb;
  char cStack_4fa;
  char cStack_4f9;
  char local_4d8;
  char cStack_4d7;
  char cStack_4d6;
  char cStack_4d5;
  char cStack_4d4;
  char cStack_4d3;
  char cStack_4d2;
  char cStack_4d1;
  char cStack_4d0;
  char cStack_4cf;
  char cStack_4ce;
  char cStack_4cd;
  char cStack_4cc;
  char cStack_4cb;
  char cStack_4ca;
  char cStack_4c9;
  char local_4c8;
  char cStack_4c7;
  char cStack_4c6;
  char cStack_4c5;
  char cStack_4c4;
  char cStack_4c3;
  char cStack_4c2;
  char cStack_4c1;
  char cStack_4c0;
  char cStack_4bf;
  char cStack_4be;
  char cStack_4bd;
  char cStack_4bc;
  char cStack_4bb;
  char cStack_4ba;
  char cStack_4b9;
  char local_498;
  char cStack_497;
  char cStack_496;
  char cStack_495;
  char cStack_494;
  char cStack_493;
  char cStack_492;
  char cStack_491;
  char cStack_490;
  char cStack_48f;
  char cStack_48e;
  char cStack_48d;
  char cStack_48c;
  char cStack_48b;
  char cStack_48a;
  char cStack_489;
  char local_458;
  char cStack_457;
  char cStack_456;
  char cStack_455;
  char cStack_454;
  char cStack_453;
  char cStack_452;
  char cStack_451;
  char cStack_450;
  char cStack_44f;
  char cStack_44e;
  char cStack_44d;
  char cStack_44c;
  char cStack_44b;
  char cStack_44a;
  char cStack_449;
  char local_448;
  char cStack_447;
  char cStack_446;
  char cStack_445;
  char cStack_444;
  char cStack_443;
  char cStack_442;
  char cStack_441;
  char cStack_440;
  char cStack_43f;
  char cStack_43e;
  char cStack_43d;
  char cStack_43c;
  char cStack_43b;
  char cStack_43a;
  char cStack_439;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char local_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  char cStack_421;
  char cStack_420;
  char cStack_41f;
  char cStack_41e;
  char cStack_41d;
  char cStack_41c;
  char cStack_41b;
  char cStack_41a;
  char cStack_419;
  char local_418;
  char cStack_417;
  char cStack_416;
  char cStack_415;
  char cStack_414;
  char cStack_413;
  char cStack_412;
  char cStack_411;
  char cStack_410;
  char cStack_40f;
  char cStack_40e;
  char cStack_40d;
  char cStack_40c;
  char cStack_40b;
  char cStack_40a;
  char cStack_409;
  char cStack_227;
  char cStack_226;
  char cStack_225;
  char cStack_224;
  char cStack_223;
  char cStack_222;
  char cStack_221;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char local_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  char local_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  char local_198;
  char cStack_197;
  char cStack_196;
  char cStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  char cStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  char cStack_189;
  char local_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  
  s2B = (int8_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_rowcol_diag_sse41_128_8","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_rowcol_diag_sse41_128_8","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_rowcol_diag_sse41_128_8","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_rowcol_diag_sse41_128_8","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_rowcol_diag_sse41_128_8","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_rowcol_diag_sse41_128_8","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_rowcol_diag_sse41_128_8","_s1Len")
        ;
        return (parasail_result_t *)0x0;
      }
    }
    local_c80 = _s1Len;
    if (matrix->type != 0) {
      local_c80 = matrix->length;
    }
    iStack_90c = 0;
    local_910 = 0;
    N._0_1_ = (char)open;
    cVar63 = (char)N;
    if (matrix->min <= -open) {
      cVar63 = -(char)matrix->min;
    }
    cVar63 = cVar63 + -0x7f;
    cVar64 = ((byte)matrix->max ^ 0x7f) - 1;
    local_850._0_3_ = CONCAT21(CONCAT11(cVar63,cVar63),cVar63);
    local_858._0_3_ = CONCAT21(CONCAT11(cVar63,cVar63),cVar63);
    vNegInf[1] = CONCAT17(cVar63,CONCAT16(cVar63,CONCAT15(cVar63,CONCAT14(cVar63,CONCAT13(cVar63,
                                                  local_858._0_3_)))));
    vSaturationCheckMax[0] =
         CONCAT17(cVar63,CONCAT16(cVar63,CONCAT15(cVar63,CONCAT14(cVar63,CONCAT13(cVar63,local_850.
                                                                                         _0_3_)))));
    local_830._0_3_ = CONCAT21(CONCAT11(cVar64,cVar64),cVar64);
    local_838._0_3_ = CONCAT21(CONCAT11(cVar64,cVar64),cVar64);
    vSaturationCheckMax[1] =
         CONCAT17(cVar64,CONCAT16(cVar64,CONCAT15(cVar64,CONCAT14(cVar64,CONCAT13(cVar64,local_838.
                                                                                         _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar64,CONCAT16(cVar64,CONCAT15(cVar64,CONCAT14(cVar64,CONCAT13(cVar64,local_830.
                                                                                         _0_3_)))));
    local_810._0_3_ = CONCAT21(CONCAT11(cVar63,cVar63),cVar63);
    local_818._0_3_ = CONCAT21(CONCAT11(cVar63,cVar63),cVar63);
    uVar33 = CONCAT17(cVar63,CONCAT16(cVar63,CONCAT15(cVar63,CONCAT14(cVar63,CONCAT13(cVar63,
                                                  local_818._0_3_)))));
    uVar99 = CONCAT17(cVar63,CONCAT16(cVar63,CONCAT15(cVar63,CONCAT14(cVar63,CONCAT13(cVar63,
                                                  local_810._0_3_)))));
    local_7f0._0_3_ = CONCAT21(CONCAT11((char)N,(char)N),(char)N);
    local_7f8._0_3_ = CONCAT21(CONCAT11((char)N,(char)N),(char)N);
    uVar34 = CONCAT17((char)N,CONCAT16((char)N,CONCAT15((char)N,CONCAT14((char)N,CONCAT13((char)N,
                                                  local_7f8._0_3_)))));
    uVar36 = CONCAT17((char)N,CONCAT16((char)N,CONCAT15((char)N,CONCAT14((char)N,CONCAT13((char)N,
                                                  local_7f0._0_3_)))));
    PAD._0_1_ = (char)gap;
    local_7d0._0_3_ = CONCAT21(CONCAT11((char)PAD,(char)PAD),(char)PAD);
    local_7d8._0_3_ = CONCAT21(CONCAT11((char)PAD,(char)PAD),(char)PAD);
    uVar35 = CONCAT17((char)PAD,
                      CONCAT16((char)PAD,
                               CONCAT15((char)PAD,
                                        CONCAT14((char)PAD,CONCAT13((char)PAD,local_7d8._0_3_)))));
    uVar37 = CONCAT17((char)PAD,
                      CONCAT16((char)PAD,
                               CONCAT15((char)PAD,
                                        CONCAT14((char)PAD,CONCAT13((char)PAD,local_7d0._0_3_)))));
    if (s1_beg == 0) {
      cVar67 = (char)PAD * '\x10';
      local_750._0_3_ = CONCAT21(CONCAT11(cVar67,cVar67),cVar67);
      local_758._0_3_ = CONCAT21(CONCAT11(cVar67,cVar67),cVar67);
      local_ca8 = CONCAT17(cVar67,CONCAT16(cVar67,CONCAT15(cVar67,CONCAT14(cVar67,CONCAT13(cVar67,
                                                  local_758._0_3_)))));
      uStack_ca0 = CONCAT17(cVar67,CONCAT16(cVar67,CONCAT15(cVar67,CONCAT14(cVar67,CONCAT13(cVar67,
                                                  local_750._0_3_)))));
    }
    else {
      local_ca8 = 0;
      uStack_ca0 = 0;
    }
    vI[0] = 0x1020304050607;
    vJreset[1] = 0x8090a0b0c0d0e0f;
    vMaxHRow[0] = uVar99;
    vMaxHCol[1] = uVar33;
    vMaxHCol[0] = uVar99;
    vLastVal[1] = uVar33;
    vLastVal[0] = uVar99;
    vEndI[1] = uVar33;
    vEndI[0] = uVar99;
    vEndJ[1] = uVar33;
    vEndJ[0] = uVar99;
    vILimit[1] = uVar33;
    s2Len_PAD._0_1_ = (char)local_c80;
    local_710._0_3_ = CONCAT21(CONCAT11((char)s2Len_PAD,(char)s2Len_PAD),(char)s2Len_PAD);
    local_718[2] = (char)s2Len_PAD;
    local_718[1] = (char)s2Len_PAD;
    local_718[0] = (char)s2Len_PAD;
    auVar45[3] = (char)s2Len_PAD;
    auVar45._0_3_ = local_718._0_3_;
    auVar45[4] = (char)s2Len_PAD;
    auVar45[5] = (char)s2Len_PAD;
    auVar45[6] = (char)s2Len_PAD;
    auVar45[7] = (char)s2Len_PAD;
    vILimit[0] = CONCAT17((char)s2Len_PAD,
                          CONCAT16((char)s2Len_PAD,
                                   CONCAT15((char)s2Len_PAD,
                                            CONCAT14((char)s2Len_PAD,
                                                     CONCAT13((char)s2Len_PAD,local_710._0_3_)))));
    auVar45._8_8_ = vILimit[0];
    auVar70._8_8_ = 0x101010101010101;
    auVar70._0_8_ = 0x101010101010101;
    auVar70 = psubsb(auVar45,auVar70);
    gap_local._0_1_ = (char)s2Len;
    local_6f0[2] = (char)gap_local;
    local_6f0[1] = (char)gap_local;
    local_6f0[0] = (char)gap_local;
    local_6f8[2] = (char)gap_local;
    local_6f8[1] = (char)gap_local;
    local_6f8[0] = (char)gap_local;
    auVar72[3] = (char)gap_local;
    auVar72._0_3_ = local_6f8._0_3_;
    auVar72[4] = (char)gap_local;
    auVar72[5] = (char)gap_local;
    auVar72[6] = (char)gap_local;
    auVar72[7] = (char)gap_local;
    auVar72[0xb] = (char)gap_local;
    auVar72._8_3_ = local_6f0._0_3_;
    auVar72[0xc] = (char)gap_local;
    auVar72[0xd] = (char)gap_local;
    auVar72[0xe] = (char)gap_local;
    auVar72[0xf] = (char)gap_local;
    auVar71._8_8_ = 0x101010101010101;
    auVar71._0_8_ = 0x101010101010101;
    auVar71 = psubsb(auVar72,auVar71);
    if (s1_beg == 0) {
      cVar78 = -(char)N;
      cVar67 = (char)(gap << 2);
      cVar75 = (char)(gap << 3);
      local_690._0_3_ =
           CONCAT21(CONCAT11(cVar78 + (char)PAD * -5,cVar78 + (char)PAD * -6),
                    ((char)PAD - cVar75) - (char)N);
      local_698._0_3_ =
           CONCAT21(CONCAT11(cVar78 + (char)PAD * -0xd,
                             ((char)PAD * '\x02' - (char)(gap << 4)) - (char)N),
                    cVar78 + (char)PAD * -0xf);
      local_cc8 = CONCAT17(cVar78 - cVar75,
                           CONCAT16(cVar78 + (char)PAD * -9,
                                    CONCAT15(cVar78 + (char)PAD * -10,
                                             CONCAT14(cVar78 + (char)PAD * -0xb,
                                                      CONCAT13(cVar78 + cVar67 * -3,local_698._0_3_)
                                                     ))));
      uStack_cc0 = CONCAT17(cVar78,CONCAT16(cVar78 - (char)PAD,
                                            CONCAT15(cVar78 + (char)PAD * -2,
                                                     CONCAT14(cVar78 + (char)PAD * -3,
                                                              CONCAT13(cVar78 - cVar67,
                                                                       local_690._0_3_)))));
    }
    else {
      local_cc8 = 0;
      uStack_cc0 = 0;
    }
    vIBoundary[0] = uStack_cc0;
    vNH[1] = local_cc8;
    _s1_local = (char *)parasail_result_new_rowcol1(local_c80,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x10101002;
      uVar38 = 0;
      if (s1_beg != 0) {
        uVar38 = 8;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar38 | ((parasail_result_t *)_s1_local)->flag;
      uVar38 = 0;
      if (s1_end != 0) {
        uVar38 = 0x10;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar38 | ((parasail_result_t *)_s1_local)->flag;
      uVar38 = 0;
      if (s2_beg != 0) {
        uVar38 = 0x4000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar38 | ((parasail_result_t *)_s1_local)->flag;
      uVar38 = 0;
      if (s2_end != 0) {
        uVar38 = 0x8000;
      }
      ((parasail_result_t *)_s1_local)->flag = uVar38 | ((parasail_result_t *)_s1_local)->flag;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      ptr_01 = parasail_memalign_int8_t(0x10,(long)(s2Len + 0x1e));
      if (ptr == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int8_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int8_t(0x10,(long)(local_c80 + 0xf));
          if (s2B == (int8_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_c80; end_query = end_query + 1) {
            s2B[end_query] = (int8_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_c80; end_query < local_c80 + 0xf; end_query = end_query + 1) {
            s2B[end_query] = '\0';
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 0xf] = (int8_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -0xf; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 0xf] = '\0';
        }
        while (end_ref = iVar1, end_ref < s2Len + 0xf) {
          ptr[(long)end_ref + 0xf] = '\0';
          iVar1 = end_ref + 1;
        }
        if (s2_beg == 0) {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 0xf] = -((char)end_ref * (char)PAD) - (char)N;
            ptr_01[(long)end_ref + 0xf] = cVar63;
          }
        }
        else {
          for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
            ptr_00[(long)end_ref + 0xf] = '\0';
            ptr_01[(long)end_ref + 0xf] = cVar63;
          }
        }
        for (end_ref = -0xf; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 0xf] = cVar63;
          ptr_01[(long)end_ref + 0xf] = cVar63;
        }
        while (end_ref = iVar1, end_ref < s2Len + 0xf) {
          ptr_00[(long)end_ref + 0xf] = cVar63;
          ptr_01[(long)end_ref + 0xf] = cVar63;
          iVar1 = end_ref + 1;
        }
        ptr_00[0xe] = '\0';
        for (end_query = 0; end_query < local_c80; end_query = end_query + 0x10) {
          vNH[0] = uVar99;
          vWH[1] = uVar33;
          vWH[0] = uVar99;
          vE[1] = uVar33;
          vE[0] = uVar99;
          vF[1] = uVar33;
          vF[0] = uVar99;
          vJ[1] = uVar33;
          vJ[0] = 0xfffefdfcfbfaf9;
          matrow0 = (int *)0xf8f7f6f5f4f3f2f1;
          piVar17 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_d04 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_c80) {
              local_d08 = end_query;
            }
            else {
              local_d08 = local_c80 + -1;
            }
            local_d04 = local_d08;
          }
          piVar18 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_d1c = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_c80) {
              local_d20 = end_query + 1;
            }
            else {
              local_d20 = local_c80 + -1;
            }
            local_d1c = local_d20;
          }
          piVar19 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_d34 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_c80) {
              local_d38 = end_query + 2;
            }
            else {
              local_d38 = local_c80 + -1;
            }
            local_d34 = local_d38;
          }
          piVar20 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_d4c = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_c80) {
              local_d50 = end_query + 3;
            }
            else {
              local_d50 = local_c80 + -1;
            }
            local_d4c = local_d50;
          }
          piVar21 = matrix->matrix;
          iVar5 = matrix->size;
          if (matrix->type == 0) {
            local_d64 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_c80) {
              local_d68 = end_query + 4;
            }
            else {
              local_d68 = local_c80 + -1;
            }
            local_d64 = local_d68;
          }
          piVar22 = matrix->matrix;
          iVar6 = matrix->size;
          if (matrix->type == 0) {
            local_d7c = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_c80) {
              local_d80 = end_query + 5;
            }
            else {
              local_d80 = local_c80 + -1;
            }
            local_d7c = local_d80;
          }
          piVar23 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_d94 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_c80) {
              local_d98 = end_query + 6;
            }
            else {
              local_d98 = local_c80 + -1;
            }
            local_d94 = local_d98;
          }
          piVar24 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_dac = (int)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_c80) {
              local_db0 = end_query + 7;
            }
            else {
              local_db0 = local_c80 + -1;
            }
            local_dac = local_db0;
          }
          piVar25 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_dc4 = (int)s2B[end_query + 8];
          }
          else {
            if (end_query + 8 < local_c80) {
              local_dc8 = end_query + 8;
            }
            else {
              local_dc8 = local_c80 + -1;
            }
            local_dc4 = local_dc8;
          }
          piVar26 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_ddc = (int)s2B[end_query + 9];
          }
          else {
            if (end_query + 9 < local_c80) {
              local_de0 = end_query + 9;
            }
            else {
              local_de0 = local_c80 + -1;
            }
            local_ddc = local_de0;
          }
          piVar27 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_df4 = (int)s2B[end_query + 10];
          }
          else {
            if (end_query + 10 < local_c80) {
              local_df8 = end_query + 10;
            }
            else {
              local_df8 = local_c80 + -1;
            }
            local_df4 = local_df8;
          }
          piVar28 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_e0c = (int)s2B[end_query + 0xb];
          }
          else {
            if (end_query + 0xb < local_c80) {
              local_e10 = end_query + 0xb;
            }
            else {
              local_e10 = local_c80 + -1;
            }
            local_e0c = local_e10;
          }
          piVar29 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_e24 = (int)s2B[end_query + 0xc];
          }
          else {
            if (end_query + 0xc < local_c80) {
              local_e28 = end_query + 0xc;
            }
            else {
              local_e28 = local_c80 + -1;
            }
            local_e24 = local_e28;
          }
          piVar30 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_e3c = (int)s2B[end_query + 0xd];
          }
          else {
            if (end_query + 0xd < local_c80) {
              local_e40 = end_query + 0xd;
            }
            else {
              local_e40 = local_c80 + -1;
            }
            local_e3c = local_e40;
          }
          piVar31 = matrix->matrix;
          iVar15 = matrix->size;
          if (matrix->type == 0) {
            local_e54 = (int)s2B[end_query + 0xe];
          }
          else {
            if (end_query + 0xe < local_c80) {
              local_e58 = end_query + 0xe;
            }
            else {
              local_e58 = local_c80 + -1;
            }
            local_e54 = local_e58;
          }
          piVar32 = matrix->matrix;
          iVar16 = matrix->size;
          if (matrix->type == 0) {
            local_e6c = (int)s2B[end_query + 0xf];
          }
          else {
            if (end_query + 0xf < local_c80) {
              local_e70 = end_query + 0xf;
            }
            else {
              local_e70 = local_c80 + -1;
            }
            local_e6c = local_e70;
          }
          cStack_1f0 = (char)vILimit[0];
          cStack_1ef = (char)((ulong)vILimit[0] >> 8);
          cStack_1ee = (char)((ulong)vILimit[0] >> 0x10);
          cStack_1ed = (char)((ulong)vILimit[0] >> 0x18);
          cStack_1ec = (char)((ulong)vILimit[0] >> 0x20);
          cStack_1eb = (char)((ulong)vILimit[0] >> 0x28);
          cStack_1ea = (char)((ulong)vILimit[0] >> 0x30);
          cStack_1e9 = (char)((ulong)vILimit[0] >> 0x38);
          local_208 = (char)vJreset[1];
          cStack_207 = vJreset[1]._1_1_;
          cStack_206 = vJreset[1]._2_1_;
          cStack_205 = vJreset[1]._3_1_;
          cStack_204 = vJreset[1]._4_1_;
          cStack_203 = vJreset[1]._5_1_;
          cStack_202 = vJreset[1]._6_1_;
          cStack_201 = vJreset[1]._7_1_;
          cStack_200 = (char)vJreset[2];
          cStack_1ff = vJreset[2]._1_1_;
          cStack_1fe = vJreset[2]._2_1_;
          cStack_1fd = vJreset[2]._3_1_;
          cStack_1fc = vJreset[2]._4_1_;
          cStack_1fb = vJreset[2]._5_1_;
          cStack_1fa = vJreset[2]._6_1_;
          cStack_1f9 = vJreset[2]._7_1_;
          local_4c8 = auVar70[0];
          cStack_4c7 = auVar70[1];
          cStack_4c6 = auVar70[2];
          cStack_4c5 = auVar70[3];
          cStack_4c4 = auVar70[4];
          cStack_4c3 = auVar70[5];
          cStack_4c2 = auVar70[6];
          cStack_4c1 = auVar70[7];
          cStack_4c0 = auVar70[8];
          cStack_4bf = auVar70[9];
          cStack_4be = auVar70[10];
          cStack_4bd = auVar70[0xb];
          cStack_4bc = auVar70[0xc];
          cStack_4bb = auVar70[0xd];
          cStack_4ba = auVar70[0xe];
          cStack_4b9 = auVar70[0xf];
          stack0xfffffffffffff568 = vWH._9_15_;
          vNH[0]._7_1_ = ptr_00[0xe];
          vE[1] = vE._9_8_;
          vWH[0] = uVar99 >> 8;
          if (s1_beg == 0) {
            local_e8c = -((char)end_query * (char)PAD) - (char)N;
          }
          else {
            local_e8c = 0;
          }
          vWH[0] = vWH[0] | (ulong)local_e8c << 0x38;
          ptr_00[0xe] = -(((char)end_query + '\x10') * (char)PAD) - (char)N;
          for (end_ref = 0; auVar45 = stack0xfffffffffffff568, auVar72 = stack0xfffffffffffff538,
              end_ref < s2Len + 0xf; end_ref = end_ref + 1) {
            stack0xfffffffffffff568 = vE._9_15_;
            vNH[0]._7_1_ = ptr_00[(long)end_ref + 0xf];
            auVar39 = stack0xfffffffffffff568;
            stack0xfffffffffffff538 = vJ._9_15_;
            vF[0]._7_1_ = ptr_01[(long)end_ref + 0xf];
            auVar40 = stack0xfffffffffffff538;
            vWH[1] = vE._9_8_;
            vNH[0] = auVar39._8_8_;
            auVar44._8_8_ = vNH[0];
            auVar44._0_8_ = vWH[1];
            auVar43._8_8_ = uVar36;
            auVar43._0_8_ = uVar34;
            auVar121 = psubsb(auVar44,auVar43);
            vJ[1] = auVar72._1_8_;
            vF[0] = auVar40._8_8_;
            auVar42._8_8_ = vF[0];
            auVar42._0_8_ = vJ[1];
            auVar41._8_8_ = uVar37;
            auVar41._0_8_ = uVar35;
            auVar72 = psubsb(auVar42,auVar41);
            local_418 = auVar121[0];
            cStack_417 = auVar121[1];
            cStack_416 = auVar121[2];
            cStack_415 = auVar121[3];
            cStack_414 = auVar121[4];
            cStack_413 = auVar121[5];
            cStack_412 = auVar121[6];
            cStack_411 = auVar121[7];
            cStack_410 = auVar121[8];
            cStack_40f = auVar121[9];
            cStack_40e = auVar121[10];
            cStack_40d = auVar121[0xb];
            cStack_40c = auVar121[0xc];
            cStack_40b = auVar121[0xd];
            cStack_40a = auVar121[0xe];
            cStack_409 = auVar121[0xf];
            local_428 = auVar72[0];
            cStack_427 = auVar72[1];
            cStack_426 = auVar72[2];
            cStack_425 = auVar72[3];
            cStack_424 = auVar72[4];
            cStack_423 = auVar72[5];
            cStack_422 = auVar72[6];
            cStack_421 = auVar72[7];
            cStack_420 = auVar72[8];
            cStack_41f = auVar72[9];
            cStack_41e = auVar72[10];
            cStack_41d = auVar72[0xb];
            cStack_41c = auVar72[0xc];
            cStack_41b = auVar72[0xd];
            cStack_41a = auVar72[0xe];
            cStack_419 = auVar72[0xf];
            bVar65 = (local_418 < local_428) * local_428 | (local_418 >= local_428) * local_418;
            bVar73 = (cStack_417 < cStack_427) * cStack_427 |
                     (cStack_417 >= cStack_427) * cStack_417;
            bVar76 = (cStack_416 < cStack_426) * cStack_426 |
                     (cStack_416 >= cStack_426) * cStack_416;
            bVar79 = (cStack_415 < cStack_425) * cStack_425 |
                     (cStack_415 >= cStack_425) * cStack_415;
            bVar82 = (cStack_414 < cStack_424) * cStack_424 |
                     (cStack_414 >= cStack_424) * cStack_414;
            bVar85 = (cStack_413 < cStack_423) * cStack_423 |
                     (cStack_413 >= cStack_423) * cStack_413;
            bVar88 = (cStack_412 < cStack_422) * cStack_422 |
                     (cStack_412 >= cStack_422) * cStack_412;
            bVar91 = (cStack_411 < cStack_421) * cStack_421 |
                     (cStack_411 >= cStack_421) * cStack_411;
            bVar94 = (cStack_410 < cStack_420) * cStack_420 |
                     (cStack_410 >= cStack_420) * cStack_410;
            bVar100 = (cStack_40f < cStack_41f) * cStack_41f |
                      (cStack_40f >= cStack_41f) * cStack_40f;
            bVar103 = (cStack_40e < cStack_41e) * cStack_41e |
                      (cStack_40e >= cStack_41e) * cStack_40e;
            bVar106 = (cStack_40d < cStack_41d) * cStack_41d |
                      (cStack_40d >= cStack_41d) * cStack_40d;
            bVar109 = (cStack_40c < cStack_41c) * cStack_41c |
                      (cStack_40c >= cStack_41c) * cStack_40c;
            bVar112 = (cStack_40b < cStack_41b) * cStack_41b |
                      (cStack_40b >= cStack_41b) * cStack_40b;
            bVar115 = (cStack_40a < cStack_41a) * cStack_41a |
                      (cStack_40a >= cStack_41a) * cStack_40a;
            bVar118 = (cStack_409 < cStack_419) * cStack_419 |
                      (cStack_409 >= cStack_419) * cStack_409;
            vJ[1] = CONCAT17(bVar91,CONCAT16(bVar88,CONCAT15(bVar85,CONCAT14(bVar82,CONCAT13(bVar79,
                                                  CONCAT12(bVar76,CONCAT11(bVar73,bVar65)))))));
            vF[0]._0_1_ = bVar94;
            vF[0]._1_1_ = bVar100;
            vF[0]._2_1_ = bVar103;
            vF[0]._3_1_ = bVar106;
            vF[0]._4_1_ = bVar109;
            vF[0]._5_1_ = bVar112;
            vF[0]._6_1_ = bVar115;
            vF[0]._7_1_ = bVar118;
            auVar121._8_8_ = uVar36;
            auVar121._0_8_ = uVar34;
            auVar121 = psubsb(stack0xfffffffffffff558,auVar121);
            auVar40._8_8_ = uVar37;
            auVar40._0_8_ = uVar35;
            auVar72 = psubsb(stack0xfffffffffffff548,auVar40);
            local_438 = auVar121[0];
            cStack_437 = auVar121[1];
            cStack_436 = auVar121[2];
            cStack_435 = auVar121[3];
            cStack_434 = auVar121[4];
            cStack_433 = auVar121[5];
            cStack_432 = auVar121[6];
            cStack_431 = auVar121[7];
            cStack_430 = auVar121[8];
            cStack_42f = auVar121[9];
            cStack_42e = auVar121[10];
            cStack_42d = auVar121[0xb];
            cStack_42c = auVar121[0xc];
            cStack_42b = auVar121[0xd];
            cStack_42a = auVar121[0xe];
            cStack_429 = auVar121[0xf];
            local_448 = auVar72[0];
            cStack_447 = auVar72[1];
            cStack_446 = auVar72[2];
            cStack_445 = auVar72[3];
            cStack_444 = auVar72[4];
            cStack_443 = auVar72[5];
            cStack_442 = auVar72[6];
            cStack_441 = auVar72[7];
            cStack_440 = auVar72[8];
            cStack_43f = auVar72[9];
            cStack_43e = auVar72[10];
            cStack_43d = auVar72[0xb];
            cStack_43c = auVar72[0xc];
            cStack_43b = auVar72[0xd];
            cStack_43a = auVar72[0xe];
            cStack_439 = auVar72[0xf];
            bVar66 = (local_438 < local_448) * local_448 | (local_438 >= local_448) * local_438;
            bVar74 = (cStack_437 < cStack_447) * cStack_447 |
                     (cStack_437 >= cStack_447) * cStack_437;
            bVar77 = (cStack_436 < cStack_446) * cStack_446 |
                     (cStack_436 >= cStack_446) * cStack_436;
            bVar80 = (cStack_435 < cStack_445) * cStack_445 |
                     (cStack_435 >= cStack_445) * cStack_435;
            bVar83 = (cStack_434 < cStack_444) * cStack_444 |
                     (cStack_434 >= cStack_444) * cStack_434;
            bVar86 = (cStack_433 < cStack_443) * cStack_443 |
                     (cStack_433 >= cStack_443) * cStack_433;
            bVar89 = (cStack_432 < cStack_442) * cStack_442 |
                     (cStack_432 >= cStack_442) * cStack_432;
            bVar92 = (cStack_431 < cStack_441) * cStack_441 |
                     (cStack_431 >= cStack_441) * cStack_431;
            bVar95 = (cStack_430 < cStack_440) * cStack_440 |
                     (cStack_430 >= cStack_440) * cStack_430;
            bVar101 = (cStack_42f < cStack_43f) * cStack_43f |
                      (cStack_42f >= cStack_43f) * cStack_42f;
            bVar104 = (cStack_42e < cStack_43e) * cStack_43e |
                      (cStack_42e >= cStack_43e) * cStack_42e;
            bVar107 = (cStack_42d < cStack_43d) * cStack_43d |
                      (cStack_42d >= cStack_43d) * cStack_42d;
            bVar110 = (cStack_42c < cStack_43c) * cStack_43c |
                      (cStack_42c >= cStack_43c) * cStack_42c;
            bVar113 = (cStack_42b < cStack_43b) * cStack_43b |
                      (cStack_42b >= cStack_43b) * cStack_42b;
            bVar116 = (cStack_42a < cStack_43a) * cStack_43a |
                      (cStack_42a >= cStack_43a) * cStack_42a;
            bVar119 = (cStack_429 < cStack_439) * cStack_439 |
                      (cStack_429 >= cStack_439) * cStack_429;
            vF[1] = CONCAT17(bVar92,CONCAT16(bVar89,CONCAT15(bVar86,CONCAT14(bVar83,CONCAT13(bVar80,
                                                  CONCAT12(bVar77,CONCAT11(bVar74,bVar66)))))));
            vE[0]._0_1_ = bVar95;
            vE[0]._1_1_ = bVar101;
            vE[0]._2_1_ = bVar104;
            vE[0]._3_1_ = bVar107;
            vE[0]._4_1_ = bVar110;
            vE[0]._5_1_ = bVar113;
            vE[0]._6_1_ = bVar116;
            vE[0]._7_1_ = bVar119;
            local_6b0[2] = (char)piVar22[(long)(iVar6 * local_d7c) +
                                         (long)ptr[(long)(end_ref + -5) + 0xf]];
            local_6b0[1] = (char)piVar23[(long)(iVar7 * local_d94) +
                                         (long)ptr[(long)(end_ref + -6) + 0xf]];
            local_6b0[0] = (char)piVar24[(long)(iVar8 * local_dac) +
                                         (long)ptr[(long)(end_ref + -7) + 0xf]];
            local_6b8[2] = (char)piVar30[(long)(iVar14 * local_e3c) +
                                         (long)ptr[(long)(end_ref + -0xd) + 0xf]];
            local_6b8[1] = (char)(piVar31 + iVar15 * local_e54)[ptr[(long)(end_ref + -0xe) + 0xf]];
            local_6b8[0] = (char)piVar32[(long)(iVar16 * local_e6c) +
                                         (long)ptr[(long)(end_ref + -0xf) + 0xf]];
            auVar48[3] = (char)piVar29[(long)(iVar13 * local_e24) +
                                       (long)ptr[(long)(end_ref + -0xc) + 0xf]];
            auVar48._0_3_ = local_6b8._0_3_;
            auVar48[4] = (char)piVar28[(long)(iVar12 * local_e0c) +
                                       (long)ptr[(long)(end_ref + -0xb) + 0xf]];
            auVar48[5] = (char)piVar27[(long)(iVar11 * local_df4) +
                                       (long)ptr[(long)(end_ref + -10) + 0xf]];
            auVar48[6] = (char)piVar26[(long)(iVar10 * local_ddc) +
                                       (long)ptr[(long)(end_ref + -9) + 0xf]];
            auVar48[7] = (char)piVar25[(long)(iVar9 * local_dc4) +
                                       (long)ptr[(long)(end_ref + -8) + 0xf]];
            auVar48[0xb] = (char)piVar21[(long)(iVar5 * local_d64) +
                                         (long)ptr[(long)(end_ref + -4) + 0xf]];
            auVar48._8_3_ = local_6b0._0_3_;
            auVar48[0xc] = (char)piVar20[(long)(iVar4 * local_d4c) +
                                         (long)ptr[(long)(end_ref + -3) + 0xf]];
            auVar48[0xd] = (char)piVar19[(long)(iVar3 * local_d34) +
                                         (long)ptr[(long)(end_ref + -2) + 0xf]];
            auVar48[0xe] = (char)piVar18[(long)(iVar2 * local_d1c) +
                                         (long)ptr[(long)(end_ref + -1) + 0xf]];
            auVar48[0xf] = (char)piVar17[(long)(iVar1 * local_d04) + (long)ptr[(long)end_ref + 0xf]]
            ;
            auVar72 = paddsb(auVar45,auVar48);
            local_458 = auVar72[0];
            cStack_457 = auVar72[1];
            cStack_456 = auVar72[2];
            cStack_455 = auVar72[3];
            cStack_454 = auVar72[4];
            cStack_453 = auVar72[5];
            cStack_452 = auVar72[6];
            cStack_451 = auVar72[7];
            cStack_450 = auVar72[8];
            cStack_44f = auVar72[9];
            cStack_44e = auVar72[10];
            cStack_44d = auVar72[0xb];
            cStack_44c = auVar72[0xc];
            cStack_44b = auVar72[0xd];
            cStack_44a = auVar72[0xe];
            cStack_449 = auVar72[0xf];
            bVar66 = (local_458 < (char)bVar66) * bVar66 | (local_458 >= (char)bVar66) * local_458;
            bVar74 = (cStack_457 < (char)bVar74) * bVar74 |
                     (cStack_457 >= (char)bVar74) * cStack_457;
            bVar77 = (cStack_456 < (char)bVar77) * bVar77 |
                     (cStack_456 >= (char)bVar77) * cStack_456;
            bVar80 = (cStack_455 < (char)bVar80) * bVar80 |
                     (cStack_455 >= (char)bVar80) * cStack_455;
            bVar83 = (cStack_454 < (char)bVar83) * bVar83 |
                     (cStack_454 >= (char)bVar83) * cStack_454;
            bVar86 = (cStack_453 < (char)bVar86) * bVar86 |
                     (cStack_453 >= (char)bVar86) * cStack_453;
            bVar89 = (cStack_452 < (char)bVar89) * bVar89 |
                     (cStack_452 >= (char)bVar89) * cStack_452;
            bVar92 = (cStack_451 < (char)bVar92) * bVar92 |
                     (cStack_451 >= (char)bVar92) * cStack_451;
            bVar95 = (cStack_450 < (char)bVar95) * bVar95 |
                     (cStack_450 >= (char)bVar95) * cStack_450;
            bVar101 = (cStack_44f < (char)bVar101) * bVar101 |
                      (cStack_44f >= (char)bVar101) * cStack_44f;
            bVar104 = (cStack_44e < (char)bVar104) * bVar104 |
                      (cStack_44e >= (char)bVar104) * cStack_44e;
            bVar107 = (cStack_44d < (char)bVar107) * bVar107 |
                      (cStack_44d >= (char)bVar107) * cStack_44d;
            bVar110 = (cStack_44c < (char)bVar110) * bVar110 |
                      (cStack_44c >= (char)bVar110) * cStack_44c;
            bVar113 = (cStack_44b < (char)bVar113) * bVar113 |
                      (cStack_44b >= (char)bVar113) * cStack_44b;
            bVar116 = (cStack_44a < (char)bVar116) * bVar116 |
                      (cStack_44a >= (char)bVar116) * cStack_44a;
            bVar119 = (cStack_449 < (char)bVar119) * bVar119 |
                      (cStack_449 >= (char)bVar119) * cStack_449;
            vE[1] = CONCAT17(((char)bVar92 < (char)bVar91) * bVar91 |
                             ((char)bVar92 >= (char)bVar91) * bVar92,
                             CONCAT16(((char)bVar89 < (char)bVar88) * bVar88 |
                                      ((char)bVar89 >= (char)bVar88) * bVar89,
                                      CONCAT15(((char)bVar86 < (char)bVar85) * bVar85 |
                                               ((char)bVar86 >= (char)bVar85) * bVar86,
                                               CONCAT14(((char)bVar83 < (char)bVar82) * bVar82 |
                                                        ((char)bVar83 >= (char)bVar82) * bVar83,
                                                        CONCAT13(((char)bVar80 < (char)bVar79) *
                                                                 bVar79 | ((char)bVar80 >=
                                                                          (char)bVar79) * bVar80,
                                                                 CONCAT12(((char)bVar77 <
                                                                          (char)bVar76) * bVar76 |
                                                                          ((char)bVar77 >=
                                                                          (char)bVar76) * bVar77,
                                                                          CONCAT11(((char)bVar74 <
                                                                                   (char)bVar73) *
                                                                                   bVar73 | ((char)
                                                  bVar74 >= (char)bVar73) * bVar74,
                                                  ((char)bVar66 < (char)bVar65) * bVar65 |
                                                  ((char)bVar66 >= (char)bVar65) * bVar66)))))));
            vWH[0]._0_1_ = ((char)bVar95 < (char)bVar94) * bVar94 |
                           ((char)bVar95 >= (char)bVar94) * bVar95;
            vWH[0]._1_1_ = ((char)bVar101 < (char)bVar100) * bVar100 |
                           ((char)bVar101 >= (char)bVar100) * bVar101;
            vWH[0]._2_1_ = ((char)bVar104 < (char)bVar103) * bVar103 |
                           ((char)bVar104 >= (char)bVar103) * bVar104;
            vWH[0]._3_1_ = ((char)bVar107 < (char)bVar106) * bVar106 |
                           ((char)bVar107 >= (char)bVar106) * bVar107;
            vWH[0]._4_1_ = ((char)bVar110 < (char)bVar109) * bVar109 |
                           ((char)bVar110 >= (char)bVar109) * bVar110;
            vWH[0]._5_1_ = ((char)bVar113 < (char)bVar112) * bVar112 |
                           ((char)bVar113 >= (char)bVar112) * bVar113;
            vWH[0]._6_1_ = ((char)bVar116 < (char)bVar115) * bVar115 |
                           ((char)bVar116 >= (char)bVar115) * bVar116;
            vWH[0]._7_1_ = ((char)bVar119 < (char)bVar118) * bVar118 |
                           ((char)bVar119 >= (char)bVar118) * bVar119;
            local_4d8 = (char)matrow0;
            cStack_4d7 = matrow0._1_1_;
            cStack_4d6 = matrow0._2_1_;
            cStack_4d5 = matrow0._3_1_;
            cStack_4d4 = matrow0._4_1_;
            cStack_4d3 = matrow0._5_1_;
            cStack_4d2 = matrow0._6_1_;
            cStack_4d1 = matrow0._7_1_;
            cStack_4d0 = matrow0._8_1_;
            cStack_4cf = matrow0._9_1_;
            cStack_4ce = matrow0._10_1_;
            cStack_4cd = matrow0._11_1_;
            cStack_4cc = matrow0._12_1_;
            cStack_4cb = matrow0._13_1_;
            cStack_4ca = matrow0._14_1_;
            cStack_4c9 = matrow0._15_1_;
            cVar67 = -(local_4d8 == -1);
            cVar75 = -(cStack_4d7 == -1);
            cVar78 = -(cStack_4d6 == -1);
            cVar81 = -(cStack_4d5 == -1);
            cVar84 = -(cStack_4d4 == -1);
            cVar87 = -(cStack_4d3 == -1);
            cVar90 = -(cStack_4d2 == -1);
            cVar93 = -(cStack_4d1 == -1);
            cVar96 = -(cStack_4d0 == -1);
            cVar102 = -(cStack_4cf == -1);
            cVar105 = -(cStack_4ce == -1);
            cVar108 = -(cStack_4cd == -1);
            cVar111 = -(cStack_4cc == -1);
            cVar114 = -(cStack_4cb == -1);
            cVar117 = -(cStack_4ca == -1);
            cVar120 = -(cStack_4c9 == -1);
            auVar60[1] = cVar75;
            auVar60[0] = cVar67;
            auVar60[2] = cVar78;
            auVar60[3] = cVar81;
            auVar60[4] = cVar84;
            auVar60[5] = cVar87;
            auVar60[6] = cVar90;
            auVar60[7] = cVar93;
            auVar60[9] = cVar102;
            auVar60[8] = cVar96;
            auVar60[10] = cVar105;
            auVar60[0xb] = cVar108;
            auVar60[0xc] = cVar111;
            auVar60[0xd] = cVar114;
            auVar60[0xe] = cVar117;
            auVar60[0xf] = cVar120;
            auVar61._8_8_ = vWH[0];
            auVar61._0_8_ = vE[1];
            register0x00001240 = pblendvb(auVar61,stack0xfffffffffffff578,auVar60);
            auVar57[1] = cVar75;
            auVar57[0] = cVar67;
            auVar57[2] = cVar78;
            auVar57[3] = cVar81;
            auVar57[4] = cVar84;
            auVar57[5] = cVar87;
            auVar57[6] = cVar90;
            auVar57[7] = cVar93;
            auVar57[9] = cVar102;
            auVar57[8] = cVar96;
            auVar57[10] = cVar105;
            auVar57[0xb] = cVar108;
            auVar57[0xc] = cVar111;
            auVar57[0xd] = cVar114;
            auVar57[0xe] = cVar117;
            auVar57[0xf] = cVar120;
            auVar59._8_8_ = vF[0];
            auVar59._0_8_ = vJ[1];
            auVar58._8_8_ = uVar99;
            auVar58._0_8_ = uVar33;
            register0x00001240 = pblendvb(auVar59,auVar58,auVar57);
            auVar54[1] = cVar75;
            auVar54[0] = cVar67;
            auVar54[2] = cVar78;
            auVar54[3] = cVar81;
            auVar54[4] = cVar84;
            auVar54[5] = cVar87;
            auVar54[6] = cVar90;
            auVar54[7] = cVar93;
            auVar54[9] = cVar102;
            auVar54[8] = cVar96;
            auVar54[10] = cVar105;
            auVar54[0xb] = cVar108;
            auVar54[0xc] = cVar111;
            auVar54[0xd] = cVar114;
            auVar54[0xe] = cVar117;
            auVar54[0xf] = cVar120;
            auVar56._8_8_ = vE[0];
            auVar56._0_8_ = vF[1];
            auVar55._8_8_ = uVar99;
            auVar55._0_8_ = uVar33;
            register0x00001240 = pblendvb(auVar56,auVar55,auVar54);
            cStack_227 = vE[1]._1_1_;
            cStack_226 = vE[1]._2_1_;
            cStack_225 = vE[1]._3_1_;
            cStack_224 = vE[1]._4_1_;
            cStack_223 = vE[1]._5_1_;
            cStack_222 = vE[1]._6_1_;
            cStack_221 = vE[1]._7_1_;
            cStack_21f = vE[2]._1_1_;
            cStack_21e = vE[2]._2_1_;
            cStack_21d = vE[2]._3_1_;
            cStack_21c = vE[2]._4_1_;
            cStack_21b = vE[2]._5_1_;
            cStack_21a = vE[2]._6_1_;
            cStack_219 = vE[2]._7_1_;
            cStack_220 = (char)vE[2];
            if (0xf < end_ref) {
              local_218 = (char)vSaturationCheckMax[1];
              cStack_217 = (char)((ulong)vSaturationCheckMax[1] >> 8);
              cStack_216 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
              cStack_215 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
              cStack_214 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
              cStack_213 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
              cStack_212 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
              cStack_211 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
              cStack_210 = (char)vSaturationCheckMin[0];
              cStack_20f = (char)((ulong)vSaturationCheckMin[0] >> 8);
              cStack_20e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
              cStack_20d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
              cStack_20c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
              cStack_20b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
              cStack_20a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
              cStack_209 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
              vSaturationCheckMax[1] =
                   CONCAT17((cStack_221 < cStack_211) * cStack_221 |
                            (cStack_221 >= cStack_211) * cStack_211,
                            CONCAT16((cStack_222 < cStack_212) * cStack_222 |
                                     (cStack_222 >= cStack_212) * cStack_212,
                                     CONCAT15((cStack_223 < cStack_213) * cStack_223 |
                                              (cStack_223 >= cStack_213) * cStack_213,
                                              CONCAT14((cStack_224 < cStack_214) * cStack_224 |
                                                       (cStack_224 >= cStack_214) * cStack_214,
                                                       CONCAT13((cStack_225 < cStack_215) *
                                                                cStack_225 |
                                                                (cStack_225 >= cStack_215) *
                                                                cStack_215,
                                                                CONCAT12((cStack_226 < cStack_216) *
                                                                         cStack_226 |
                                                                         (cStack_226 >= cStack_216)
                                                                         * cStack_216,
                                                                         CONCAT11((cStack_227 <
                                                                                  cStack_217) *
                                                                                  cStack_227 |
                                                                                  (cStack_227 >=
                                                                                  cStack_217) *
                                                                                  cStack_217,
                                                                                  ((char)vE[1] <
                                                                                  local_218) *
                                                                                  (char)vE[1] |
                                                                                  ((char)vE[1] >=
                                                                                  local_218) *
                                                                                  local_218)))))));
              vSaturationCheckMin[0] =
                   CONCAT17((cStack_219 < cStack_209) * cStack_219 |
                            (cStack_219 >= cStack_209) * cStack_209,
                            CONCAT16((cStack_21a < cStack_20a) * cStack_21a |
                                     (cStack_21a >= cStack_20a) * cStack_20a,
                                     CONCAT15((cStack_21b < cStack_20b) * cStack_21b |
                                              (cStack_21b >= cStack_20b) * cStack_20b,
                                              CONCAT14((cStack_21c < cStack_20c) * cStack_21c |
                                                       (cStack_21c >= cStack_20c) * cStack_20c,
                                                       CONCAT13((cStack_21d < cStack_20d) *
                                                                cStack_21d |
                                                                (cStack_21d >= cStack_20d) *
                                                                cStack_20d,
                                                                CONCAT12((cStack_21e < cStack_20e) *
                                                                         cStack_21e |
                                                                         (cStack_21e >= cStack_20e)
                                                                         * cStack_20e,
                                                                         CONCAT11((cStack_21f <
                                                                                  cStack_20f) *
                                                                                  cStack_21f |
                                                                                  (cStack_21f >=
                                                                                  cStack_20f) *
                                                                                  cStack_20f,
                                                                                  (cStack_220 <
                                                                                  cStack_210) *
                                                                                  cStack_220 |
                                                                                  (cStack_220 >=
                                                                                  cStack_210) *
                                                                                  cStack_210)))))));
              local_498 = (char)vNegInf[1];
              cStack_497 = (char)((ulong)vNegInf[1] >> 8);
              cStack_496 = (char)((ulong)vNegInf[1] >> 0x10);
              cStack_495 = (char)((ulong)vNegInf[1] >> 0x18);
              cStack_494 = (char)((ulong)vNegInf[1] >> 0x20);
              cStack_493 = (char)((ulong)vNegInf[1] >> 0x28);
              cStack_492 = (char)((ulong)vNegInf[1] >> 0x30);
              cStack_491 = (char)((ulong)vNegInf[1] >> 0x38);
              cStack_490 = (char)vSaturationCheckMax[0];
              cStack_48f = (char)((ulong)vSaturationCheckMax[0] >> 8);
              cStack_48e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
              cStack_48d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
              cStack_48c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
              cStack_48b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
              cStack_48a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
              cStack_489 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
              vNegInf[1] = CONCAT17((cStack_491 < cStack_221) * cStack_221 |
                                    (cStack_491 >= cStack_221) * cStack_491,
                                    CONCAT16((cStack_492 < cStack_222) * cStack_222 |
                                             (cStack_492 >= cStack_222) * cStack_492,
                                             CONCAT15((cStack_493 < cStack_223) * cStack_223 |
                                                      (cStack_493 >= cStack_223) * cStack_493,
                                                      CONCAT14((cStack_494 < cStack_224) *
                                                               cStack_224 |
                                                               (cStack_494 >= cStack_224) *
                                                               cStack_494,
                                                               CONCAT13((cStack_495 < cStack_225) *
                                                                        cStack_225 |
                                                                        (cStack_495 >= cStack_225) *
                                                                        cStack_495,
                                                                        CONCAT12((cStack_496 <
                                                                                 cStack_226) *
                                                                                 cStack_226 |
                                                                                 (cStack_496 >=
                                                                                 cStack_226) *
                                                                                 cStack_496,
                                                                                 CONCAT11((
                                                  cStack_497 < cStack_227) * cStack_227 |
                                                  (cStack_497 >= cStack_227) * cStack_497,
                                                  (local_498 < (char)vE[1]) * (char)vE[1] |
                                                  (local_498 >= (char)vE[1]) * local_498)))))));
              vSaturationCheckMax[0] =
                   CONCAT17((cStack_489 < cStack_219) * cStack_219 |
                            (cStack_489 >= cStack_219) * cStack_489,
                            CONCAT16((cStack_48a < cStack_21a) * cStack_21a |
                                     (cStack_48a >= cStack_21a) * cStack_48a,
                                     CONCAT15((cStack_48b < cStack_21b) * cStack_21b |
                                              (cStack_48b >= cStack_21b) * cStack_48b,
                                              CONCAT14((cStack_48c < cStack_21c) * cStack_21c |
                                                       (cStack_48c >= cStack_21c) * cStack_48c,
                                                       CONCAT13((cStack_48d < cStack_21d) *
                                                                cStack_21d |
                                                                (cStack_48d >= cStack_21d) *
                                                                cStack_48d,
                                                                CONCAT12((cStack_48e < cStack_21e) *
                                                                         cStack_21e |
                                                                         (cStack_48e >= cStack_21e)
                                                                         * cStack_48e,
                                                                         CONCAT11((cStack_48f <
                                                                                  cStack_21f) *
                                                                                  cStack_21f |
                                                                                  (cStack_48f >=
                                                                                  cStack_21f) *
                                                                                  cStack_48f,
                                                                                  (cStack_490 <
                                                                                  cStack_220) *
                                                                                  cStack_220 |
                                                                                  (cStack_490 >=
                                                                                  cStack_220) *
                                                                                  cStack_490)))))));
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_c80;
            vWH_00[1]._4_4_ = 0;
            arr_store_rowcol(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,
                             ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_col,vWH_00
                             ,end_ref,s2Len,in_stack_fffffffffffff148,
                             (int32_t)(piVar31 + iVar15 * local_e54));
            ptr_00[(long)(end_ref + -0xf) + 0xf] = (char)vE[1];
            ptr_01[(long)(end_ref + -0xf) + 0xf] = (int8_t)vJ[1];
            local_508 = auVar71[0];
            cStack_507 = auVar71[1];
            cStack_506 = auVar71[2];
            cStack_505 = auVar71[3];
            cStack_504 = auVar71[4];
            cStack_503 = auVar71[5];
            cStack_502 = auVar71[6];
            cStack_501 = auVar71[7];
            cStack_500 = auVar71[8];
            cStack_4ff = auVar71[9];
            cStack_4fe = auVar71[10];
            cStack_4fd = auVar71[0xb];
            cStack_4fc = auVar71[0xc];
            cStack_4fb = auVar71[0xd];
            cStack_4fa = auVar71[0xe];
            cStack_4f9 = auVar71[0xf];
            local_168 = (char)vMaxHCol[1];
            cStack_167 = vMaxHCol[1]._1_1_;
            cStack_166 = vMaxHCol[1]._2_1_;
            cStack_165 = vMaxHCol[1]._3_1_;
            cStack_164 = vMaxHCol[1]._4_1_;
            cStack_163 = vMaxHCol[1]._5_1_;
            cStack_162 = vMaxHCol[1]._6_1_;
            cStack_161 = vMaxHCol[1]._7_1_;
            cStack_160 = (char)vMaxHCol[2];
            cStack_15f = vMaxHCol[2]._1_1_;
            cStack_15e = vMaxHCol[2]._2_1_;
            cStack_15d = vMaxHCol[2]._3_1_;
            cStack_15c = vMaxHCol[2]._4_1_;
            cStack_15b = vMaxHCol[2]._5_1_;
            cStack_15a = vMaxHCol[2]._6_1_;
            cStack_159 = vMaxHCol[2]._7_1_;
            local_188 = (char)vLastVal[1];
            cStack_187 = vLastVal[1]._1_1_;
            cStack_186 = vLastVal[1]._2_1_;
            cStack_185 = vLastVal[1]._3_1_;
            cStack_184 = vLastVal[1]._4_1_;
            cStack_183 = vLastVal[1]._5_1_;
            cStack_182 = vLastVal[1]._6_1_;
            cStack_181 = vLastVal[1]._7_1_;
            cStack_180 = (char)vLastVal[2];
            cStack_17f = vLastVal[2]._1_1_;
            cStack_17e = vLastVal[2]._2_1_;
            cStack_17d = vLastVal[2]._3_1_;
            cStack_17c = vLastVal[2]._4_1_;
            cStack_17b = vLastVal[2]._5_1_;
            cStack_17a = vLastVal[2]._6_1_;
            cStack_179 = vLastVal[2]._7_1_;
            uVar68 = CONCAT17(-(cStack_161 < cStack_221),
                              CONCAT16(-(cStack_162 < cStack_222),
                                       CONCAT15(-(cStack_163 < cStack_223),
                                                CONCAT14(-(cStack_164 < cStack_224),
                                                         CONCAT13(-(cStack_165 < cStack_225),
                                                                  CONCAT12(-(cStack_166 < cStack_226
                                                                            ),CONCAT11(-(cStack_167
                                                                                        < cStack_227
                                                                                        ),-(
                                                  local_168 < (char)vE[1])))))))) &
                     CONCAT17(-(cStack_201 == cStack_4c1),
                              CONCAT16(-(cStack_202 == cStack_4c2),
                                       CONCAT15(-(cStack_203 == cStack_4c3),
                                                CONCAT14(-(cStack_204 == cStack_4c4),
                                                         CONCAT13(-(cStack_205 == cStack_4c5),
                                                                  CONCAT12(-(cStack_206 ==
                                                                            cStack_4c6),
                                                                           CONCAT11(-(cStack_207 ==
                                                                                     cStack_4c7),
                                                                                    -(local_208 ==
                                                                                     local_4c8))))))
                                      )) &
                     CONCAT17(-(-1 < cStack_4d1),
                              CONCAT16(-(-1 < cStack_4d2),
                                       CONCAT15(-(-1 < cStack_4d3),
                                                CONCAT14(-(-1 < cStack_4d4),
                                                         CONCAT13(-(-1 < cStack_4d5),
                                                                  CONCAT12(-(-1 < cStack_4d6),
                                                                           CONCAT11(-(-1 < 
                                                  cStack_4d7),-(-1 < local_4d8)))))))) &
                     CONCAT17(-(cStack_4d1 < (char)gap_local),
                              CONCAT16(-(cStack_4d2 < (char)gap_local),
                                       CONCAT15(-(cStack_4d3 < (char)gap_local),
                                                CONCAT14(-(cStack_4d4 < (char)gap_local),
                                                         CONCAT13(-(cStack_4d5 < (char)gap_local),
                                                                  CONCAT12(-(cStack_4d6 <
                                                                            (char)gap_local),
                                                                           CONCAT11(-(cStack_4d7 <
                                                                                     (char)gap_local
                                                                                     ),-(local_4d8 <
                                                                                        (char)
                                                  gap_local))))))));
            uVar97 = CONCAT17(-(cStack_159 < cStack_219),
                              CONCAT16(-(cStack_15a < cStack_21a),
                                       CONCAT15(-(cStack_15b < cStack_21b),
                                                CONCAT14(-(cStack_15c < cStack_21c),
                                                         CONCAT13(-(cStack_15d < cStack_21d),
                                                                  CONCAT12(-(cStack_15e < cStack_21e
                                                                            ),CONCAT11(-(cStack_15f
                                                                                        < cStack_21f
                                                                                        ),-(
                                                  cStack_160 < cStack_220)))))))) &
                     CONCAT17(-(cStack_1f9 == cStack_4b9),
                              CONCAT16(-(cStack_1fa == cStack_4ba),
                                       CONCAT15(-(cStack_1fb == cStack_4bb),
                                                CONCAT14(-(cStack_1fc == cStack_4bc),
                                                         CONCAT13(-(cStack_1fd == cStack_4bd),
                                                                  CONCAT12(-(cStack_1fe ==
                                                                            cStack_4be),
                                                                           CONCAT11(-(cStack_1ff ==
                                                                                     cStack_4bf),
                                                                                    -(cStack_200 ==
                                                                                     cStack_4c0)))))
                                               ))) &
                     CONCAT17(-(-1 < cStack_4c9),
                              CONCAT16(-(-1 < cStack_4ca),
                                       CONCAT15(-(-1 < cStack_4cb),
                                                CONCAT14(-(-1 < cStack_4cc),
                                                         CONCAT13(-(-1 < cStack_4cd),
                                                                  CONCAT12(-(-1 < cStack_4ce),
                                                                           CONCAT11(-(-1 < 
                                                  cStack_4cf),-(-1 < cStack_4d0)))))))) &
                     CONCAT17(-(cStack_4c9 < (char)gap_local),
                              CONCAT16(-(cStack_4ca < (char)gap_local),
                                       CONCAT15(-(cStack_4cb < (char)gap_local),
                                                CONCAT14(-(cStack_4cc < (char)gap_local),
                                                         CONCAT13(-(cStack_4cd < (char)gap_local),
                                                                  CONCAT12(-(cStack_4ce <
                                                                            (char)gap_local),
                                                                           CONCAT11(-(cStack_4cf <
                                                                                     (char)gap_local
                                                                                     ),-(cStack_4d0
                                                                                        < (char)
                                                  gap_local))))))));
            uVar69 = CONCAT17(-(cStack_181 < cStack_221),
                              CONCAT16(-(cStack_182 < cStack_222),
                                       CONCAT15(-(cStack_183 < cStack_223),
                                                CONCAT14(-(cStack_184 < cStack_224),
                                                         CONCAT13(-(cStack_185 < cStack_225),
                                                                  CONCAT12(-(cStack_186 < cStack_226
                                                                            ),CONCAT11(-(cStack_187
                                                                                        < cStack_227
                                                                                        ),-(
                                                  local_188 < (char)vE[1])))))))) &
                     CONCAT17(-(cStack_201 < (char)s2Len_PAD),
                              CONCAT16(-(cStack_202 < (char)s2Len_PAD),
                                       CONCAT15(-(cStack_203 < (char)s2Len_PAD),
                                                CONCAT14(-(cStack_204 < (char)s2Len_PAD),
                                                         CONCAT13(-(cStack_205 < (char)s2Len_PAD),
                                                                  CONCAT12(-(cStack_206 <
                                                                            (char)s2Len_PAD),
                                                                           CONCAT11(-(cStack_207 <
                                                                                     (char)s2Len_PAD
                                                                                     ),-(local_208 <
                                                                                        (char)
                                                  s2Len_PAD)))))))) &
                     CONCAT17(-(cStack_4d1 == cStack_501),
                              CONCAT16(-(cStack_4d2 == cStack_502),
                                       CONCAT15(-(cStack_4d3 == cStack_503),
                                                CONCAT14(-(cStack_4d4 == cStack_504),
                                                         CONCAT13(-(cStack_4d5 == cStack_505),
                                                                  CONCAT12(-(cStack_4d6 ==
                                                                            cStack_506),
                                                                           CONCAT11(-(cStack_4d7 ==
                                                                                     cStack_507),
                                                                                    -(local_4d8 ==
                                                                                     local_508))))))
                                      ));
            uVar98 = CONCAT17(-(cStack_179 < cStack_219),
                              CONCAT16(-(cStack_17a < cStack_21a),
                                       CONCAT15(-(cStack_17b < cStack_21b),
                                                CONCAT14(-(cStack_17c < cStack_21c),
                                                         CONCAT13(-(cStack_17d < cStack_21d),
                                                                  CONCAT12(-(cStack_17e < cStack_21e
                                                                            ),CONCAT11(-(cStack_17f
                                                                                        < cStack_21f
                                                                                        ),-(
                                                  cStack_180 < cStack_220)))))))) &
                     CONCAT17(-(cStack_1f9 < cStack_1e9),
                              CONCAT16(-(cStack_1fa < cStack_1ea),
                                       CONCAT15(-(cStack_1fb < cStack_1eb),
                                                CONCAT14(-(cStack_1fc < cStack_1ec),
                                                         CONCAT13(-(cStack_1fd < cStack_1ed),
                                                                  CONCAT12(-(cStack_1fe < cStack_1ee
                                                                            ),CONCAT11(-(cStack_1ff
                                                                                        < cStack_1ef
                                                                                        ),-(
                                                  cStack_200 < cStack_1f0)))))))) &
                     CONCAT17(-(cStack_4c9 == cStack_4f9),
                              CONCAT16(-(cStack_4ca == cStack_4fa),
                                       CONCAT15(-(cStack_4cb == cStack_4fb),
                                                CONCAT14(-(cStack_4cc == cStack_4fc),
                                                         CONCAT13(-(cStack_4cd == cStack_4fd),
                                                                  CONCAT12(-(cStack_4ce ==
                                                                            cStack_4fe),
                                                                           CONCAT11(-(cStack_4cf ==
                                                                                     cStack_4ff),
                                                                                    -(cStack_4d0 ==
                                                                                     cStack_500)))))
                                               )));
            auVar53._8_8_ = uVar97;
            auVar53._0_8_ = uVar68;
            register0x00001240 = pblendvb(stack0xfffffffffffff608,register0x00001240,auVar53);
            auVar52._8_8_ = uVar98;
            auVar52._0_8_ = uVar69;
            register0x00001240 = pblendvb(stack0xfffffffffffff5f8,register0x00001240,auVar52);
            auVar51._8_8_ =
                 CONCAT17(-(cStack_1f9 == cStack_4b9),
                          CONCAT16(-(cStack_1fa == cStack_4ba),
                                   CONCAT15(-(cStack_1fb == cStack_4bb),
                                            CONCAT14(-(cStack_1fc == cStack_4bc),
                                                     CONCAT13(-(cStack_1fd == cStack_4bd),
                                                              CONCAT12(-(cStack_1fe == cStack_4be),
                                                                       CONCAT11(-(cStack_1ff ==
                                                                                 cStack_4bf),
                                                                                -(cStack_200 ==
                                                                                 cStack_4c0))))))))
                 & CONCAT17(-(cStack_4c9 == cStack_4f9),
                            CONCAT16(-(cStack_4ca == cStack_4fa),
                                     CONCAT15(-(cStack_4cb == cStack_4fb),
                                              CONCAT14(-(cStack_4cc == cStack_4fc),
                                                       CONCAT13(-(cStack_4cd == cStack_4fd),
                                                                CONCAT12(-(cStack_4ce == cStack_4fe)
                                                                         ,CONCAT11(-(cStack_4cf ==
                                                                                    cStack_4ff),
                                                                                   -(cStack_4d0 ==
                                                                                    cStack_500))))))
                                    ));
            auVar51._0_8_ =
                 CONCAT17(-(cStack_201 == cStack_4c1),
                          CONCAT16(-(cStack_202 == cStack_4c2),
                                   CONCAT15(-(cStack_203 == cStack_4c3),
                                            CONCAT14(-(cStack_204 == cStack_4c4),
                                                     CONCAT13(-(cStack_205 == cStack_4c5),
                                                              CONCAT12(-(cStack_206 == cStack_4c6),
                                                                       CONCAT11(-(cStack_207 ==
                                                                                 cStack_4c7),
                                                                                -(local_208 ==
                                                                                 local_4c8)))))))) &
                 CONCAT17(-(cStack_4d1 == cStack_501),
                          CONCAT16(-(cStack_4d2 == cStack_502),
                                   CONCAT15(-(cStack_4d3 == cStack_503),
                                            CONCAT14(-(cStack_4d4 == cStack_504),
                                                     CONCAT13(-(cStack_4d5 == cStack_505),
                                                              CONCAT12(-(cStack_4d6 == cStack_506),
                                                                       CONCAT11(-(cStack_4d7 ==
                                                                                 cStack_507),
                                                                                -(local_4d8 ==
                                                                                 local_508))))))));
            register0x00001240 = pblendvb(stack0xfffffffffffff5e8,register0x00001240,auVar51);
            auVar50._8_8_ = uVar98;
            auVar50._0_8_ = uVar69;
            register0x00001240 = pblendvb(stack0xfffffffffffff5d8,stack0xfffffffffffff628,auVar50);
            auVar49._8_8_ = uVar97;
            auVar49._0_8_ = uVar68;
            register0x00001240 = pblendvb(stack0xfffffffffffff5c8,_matrow0,auVar49);
            auVar47._8_8_ = 0x101010101010101;
            auVar47._0_8_ = 0x101010101010101;
            _matrow0 = paddsb(_matrow0,auVar47);
            unique0x10005b7b = auVar39;
          }
          auVar46._8_8_ = 0x1010101010101010;
          auVar46._0_8_ = 0x1010101010101010;
          register0x00001200 = paddsb(stack0xfffffffffffff628,auVar46);
          auVar39._8_8_ = uStack_ca0;
          auVar39._0_8_ = local_ca8;
          register0x00001200 = psubsb(stack0xfffffffffffff578,auVar39);
        }
        t = (int8_t *)(vMaxHCol + 1);
        u = (int8_t *)(vLastVal + 1);
        i_1 = (int8_t *)(vEndI + 1);
        j_1 = (int8_t *)(vEndJ + 1);
        plStack_c78 = vILimit + 1;
        s._5_1_ = cVar63;
        s._6_1_ = cVar63;
        s._7_1_ = cVar63;
        for (local_c7c = 0; local_c7c < 0x10; local_c7c = local_c7c + 1) {
          if ((s._6_1_ < *u) || ((*u == s._6_1_ && (*j_1 < iStack_90c)))) {
            s._6_1_ = *u;
            iStack_90c = (int)*j_1;
          }
          if (s._7_1_ < *t) {
            s._7_1_ = *t;
            local_910 = (int)(char)*plStack_c78;
          }
          if (s._5_1_ < *i_1) {
            s._5_1_ = *i_1;
          }
          t = t + 1;
          u = u + 1;
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_c78 = (longlong *)((long)plStack_c78 + 1);
        }
        if ((s1_end == 0) || (s2_end == 0)) {
          if (s1_end == 0) {
            if (s2_end == 0) {
              vNegLimit[1]._5_1_ = s._5_1_;
              local_910 = s2Len + -1;
            }
            else {
              vNegLimit[1]._5_1_ = s._7_1_;
            }
            iStack_90c = local_c80 + -1;
          }
          else {
            vNegLimit[1]._5_1_ = s._6_1_;
            local_910 = s2Len + -1;
          }
        }
        else if ((s._7_1_ < s._6_1_) || ((s._6_1_ == s._7_1_ && (local_910 == s2Len + -1)))) {
          vNegLimit[1]._5_1_ = s._6_1_;
          local_910 = s2Len + -1;
        }
        else {
          vNegLimit[1]._5_1_ = s._7_1_;
          iStack_90c = local_c80 + -1;
        }
        local_1c8 = (char)vSaturationCheckMax[1];
        cStack_1c7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_1c6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_1c5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_1c4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_1c3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_1c2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_1c1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_1c0 = (char)vSaturationCheckMin[0];
        cStack_1bf = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_1be = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_1bd = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_1bc = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_1bb = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_1ba = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_1b9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_198 = (char)vNegInf[1];
        cStack_197 = (char)((ulong)vNegInf[1] >> 8);
        cStack_196 = (char)((ulong)vNegInf[1] >> 0x10);
        cStack_195 = (char)((ulong)vNegInf[1] >> 0x18);
        cStack_194 = (char)((ulong)vNegInf[1] >> 0x20);
        cStack_193 = (char)((ulong)vNegInf[1] >> 0x28);
        cStack_192 = (char)((ulong)vNegInf[1] >> 0x30);
        cStack_191 = (char)((ulong)vNegInf[1] >> 0x38);
        cStack_190 = (char)vSaturationCheckMax[0];
        cStack_18f = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_18e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_18d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_18c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_18b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_18a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_189 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar99 = CONCAT17(-(cStack_1b9 < cVar63),
                          CONCAT16(-(cStack_1ba < cVar63),
                                   CONCAT15(-(cStack_1bb < cVar63),
                                            CONCAT14(-(cStack_1bc < cVar63),
                                                     CONCAT13(-(cStack_1bd < cVar63),
                                                              CONCAT12(-(cStack_1be < cVar63),
                                                                       CONCAT11(-(cStack_1bf <
                                                                                 cVar63),-(
                                                  cStack_1c0 < cVar63)))))))) |
                 CONCAT17(-(cVar64 < cStack_189),
                          CONCAT16(-(cVar64 < cStack_18a),
                                   CONCAT15(-(cVar64 < cStack_18b),
                                            CONCAT14(-(cVar64 < cStack_18c),
                                                     CONCAT13(-(cVar64 < cStack_18d),
                                                              CONCAT12(-(cVar64 < cStack_18e),
                                                                       CONCAT11(-(cVar64 < 
                                                  cStack_18f),-(cVar64 < cStack_190))))))));
        auVar62._8_8_ = uVar99;
        auVar62._0_8_ =
             CONCAT17(-(cStack_1c1 < cVar63),
                      CONCAT16(-(cStack_1c2 < cVar63),
                               CONCAT15(-(cStack_1c3 < cVar63),
                                        CONCAT14(-(cStack_1c4 < cVar63),
                                                 CONCAT13(-(cStack_1c5 < cVar63),
                                                          CONCAT12(-(cStack_1c6 < cVar63),
                                                                   CONCAT11(-(cStack_1c7 < cVar63),
                                                                            -(local_1c8 < cVar63))))
                                                )))) |
             CONCAT17(-(cVar64 < cStack_191),
                      CONCAT16(-(cVar64 < cStack_192),
                               CONCAT15(-(cVar64 < cStack_193),
                                        CONCAT14(-(cVar64 < cStack_194),
                                                 CONCAT13(-(cVar64 < cStack_195),
                                                          CONCAT12(-(cVar64 < cStack_196),
                                                                   CONCAT11(-(cVar64 < cStack_197),
                                                                            -(cVar64 < local_198))))
                                                ))));
        if ((((((((((((((((auVar62 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar62 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar62 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar62 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar62 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar62 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar99 >> 7 & 1) != 0) || (uVar99 >> 0xf & 1) != 0) || (uVar99 >> 0x17 & 1) != 0)
               || (uVar99 >> 0x1f & 1) != 0) || (uVar99 >> 0x27 & 1) != 0) ||
             (uVar99 >> 0x2f & 1) != 0) || (uVar99 >> 0x37 & 1) != 0) || (long)uVar99 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          vNegLimit[1]._5_1_ = '\0';
          iStack_90c = 0;
          local_910 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)vNegLimit[1]._5_1_;
        ((parasail_result_t *)_s1_local)->end_query = iStack_90c;
        ((parasail_result_t *)_s1_local)->end_ref = local_910;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi8(NEG_LIMIT);
    vOpen = _mm_set1_epi8(open);
    vGap  = _mm_set1_epi8(gap);
    vOne = _mm_set1_epi8(1);
    vN = _mm_set1_epi8(N);
    vGapN = s1_beg ? _mm_set1_epi8(0) : _mm_set1_epi8(gap*N);
    vNegOne = _mm_set1_epi8(-1);
    vI = _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm_set_epi8(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi8(s1Len);
    vILimit1 = _mm_subs_epi8(vILimit, vOne);
    vJLimit = _mm_set1_epi8(s2Len);
    vJLimit1 = _mm_subs_epi8(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi8(0) : _mm_set_epi8(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m128i vIltLimit = _mm_cmplt_epi8(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi8(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 1);
        vNH = _mm_insert_epi8(vNH, H_pr[-1], 15);
        vWH = _mm_srli_si128(vWH, 1);
        vWH = _mm_insert_epi8(vWH, s1_beg ? 0 : (-open - i*gap), 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 1);
            vNH = _mm_insert_epi8(vNH, H_pr[j], 15);
            vF = _mm_srli_si128(vF, 1);
            vF = _mm_insert_epi8(vF, F_pr[j], 15);
            vF = _mm_max_epi8(
                    _mm_subs_epi8(vNH, vOpen),
                    _mm_subs_epi8(vF, vGap));
            vE = _mm_max_epi8(
                    _mm_subs_epi8(vWH, vOpen),
                    _mm_subs_epi8(vE, vGap));
            vMat = _mm_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm_adds_epi8(vNWH, vMat);
            vWH = _mm_max_epi8(vNWH, vE);
            vWH = _mm_max_epi8(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi8(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int8_t)_mm_extract_epi8(vWH,0);
            F_pr[j-15] = (int8_t)_mm_extract_epi8(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi8(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi8(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi8(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi8(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi8(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi8(vJ, vOne);
        }
        vI = _mm_adds_epi8(vI, vN);
        vIBoundary = _mm_subs_epi8(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int8_t max_row = NEG_LIMIT;
        int8_t max_col = NEG_LIMIT;
        int8_t last_val = NEG_LIMIT;
        int8_t *s = (int8_t*)&vMaxHRow;
        int8_t *t = (int8_t*)&vMaxHCol;
        int8_t *u = (int8_t*)&vLastVal;
        int8_t *i = (int8_t*)&vEndI;
        int8_t *j = (int8_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}